

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfEdgeMesh.cpp
# Opt level: O0

Info * __thiscall CMU462::Face::getInfo_abi_cxx11_(Face *this)

{
  undefined1 uVar1;
  ostream *poVar2;
  HalfedgeIter *pHVar3;
  Halfedge *this_00;
  Size SVar4;
  ostream *poVar5;
  Face *in_RSI;
  char *pcVar6;
  Info *in_RDI;
  ostringstream m5;
  ostringstream m4;
  ostringstream m3;
  ostringstream m2;
  ostringstream m1;
  Info *info;
  value_type *in_stack_fffffffffffff708;
  value_type *__x;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffff710;
  string *this_01;
  undefined7 in_stack_fffffffffffff720;
  undefined1 in_stack_fffffffffffff727;
  string local_888 [32];
  value_type local_868;
  string local_848 [32];
  string local_828 [32];
  string local_808 [32];
  string local_7e8 [32];
  string local_7c8 [32];
  string local_7a8 [32];
  _List_node_base *local_788;
  ostringstream local_780 [376];
  ostringstream local_608 [376];
  ostringstream local_490 [376];
  ostringstream local_318 [392];
  ostringstream local_190 [383];
  byte local_11;
  
  local_11 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x2337be);
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::__cxx11::ostringstream::ostringstream(local_318);
  std::__cxx11::ostringstream::ostringstream(local_490);
  std::__cxx11::ostringstream::ostringstream(local_608);
  std::__cxx11::ostringstream::ostringstream(local_780);
  std::operator<<((ostream *)local_190,"FACE");
  poVar2 = std::operator<<((ostream *)local_318,"Address: ");
  std::ostream::operator<<(poVar2,in_RSI);
  poVar2 = std::operator<<((ostream *)local_490,"Halfedge: ");
  pHVar3 = halfedge(in_RSI);
  local_788 = pHVar3->_M_node;
  this_00 = elementAddress((HalfedgeIter)0x233894);
  std::ostream::operator<<(poVar2,this_00);
  poVar2 = std::operator<<((ostream *)local_608,"Degree: ");
  SVar4 = degree((Face *)CONCAT17(in_stack_fffffffffffff727,in_stack_fffffffffffff720));
  std::ostream::operator<<(poVar2,SVar4);
  poVar5 = std::operator<<((ostream *)local_780,"Boundary: ");
  uVar1 = isBoundary(in_RSI);
  pcVar6 = "NO";
  if ((bool)uVar1) {
    pcVar6 = "YES";
  }
  std::operator<<(poVar5,pcVar6);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)this_00,(size_type)poVar2);
  std::__cxx11::ostringstream::str();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(in_stack_fffffffffffff710,in_stack_fffffffffffff708);
  std::__cxx11::string::~string(local_7a8);
  std::__cxx11::string::string(local_7c8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(in_stack_fffffffffffff710,in_stack_fffffffffffff708);
  std::__cxx11::string::~string(local_7c8);
  std::__cxx11::ostringstream::str();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(in_stack_fffffffffffff710,in_stack_fffffffffffff708);
  std::__cxx11::string::~string(local_7e8);
  std::__cxx11::ostringstream::str();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(in_stack_fffffffffffff710,in_stack_fffffffffffff708);
  std::__cxx11::string::~string(local_808);
  this_01 = local_828;
  std::__cxx11::string::string(this_01);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)this_01,in_stack_fffffffffffff708);
  std::__cxx11::string::~string(local_828);
  std::__cxx11::ostringstream::str();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)this_01,in_stack_fffffffffffff708);
  std::__cxx11::string::~string(local_848);
  __x = &local_868;
  std::__cxx11::string::string((string *)__x);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)this_01,__x);
  std::__cxx11::string::~string((string *)&local_868);
  std::__cxx11::ostringstream::str();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)this_01,__x);
  std::__cxx11::string::~string(local_888);
  local_11 = 1;
  std::__cxx11::ostringstream::~ostringstream(local_780);
  std::__cxx11::ostringstream::~ostringstream(local_608);
  std::__cxx11::ostringstream::~ostringstream(local_490);
  std::__cxx11::ostringstream::~ostringstream(local_318);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  if ((local_11 & 1) == 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)CONCAT17(uVar1,in_stack_fffffffffffff720));
  }
  return in_RDI;
}

Assistant:

Info Face::getInfo() {
  Info info;

  ostringstream m1, m2, m3, m4, m5;
  m1 << "FACE";
  m2 << "Address: " << this;
  m3 << "Halfedge: " << elementAddress(halfedge());
  m4 << "Degree: " << degree();
  m5 << "Boundary: " << (isBoundary() ? "YES" : "NO");

  info.reserve(8);
  info.push_back(m1.str());
  info.push_back(string());
  info.push_back(m2.str());
  info.push_back(m3.str());
  info.push_back(string());
  info.push_back(m4.str());
  info.push_back(string());
  info.push_back(m5.str());

  return info;
}